

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<false>::
find_insert_point(subtree_ref_base<false> *this,size_t index)

{
  ulong uVar1;
  size_t sVar2;
  word_type wVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  sbyte sVar6;
  ulong uVar7;
  ulong uVar8;
  word_type wVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  bt_impl_t *pbVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  pair<unsigned_long,_unsigned_long> pVar21;
  
  pbVar17 = this->_vector;
  uVar10 = pbVar17->degree;
  uVar20 = (pbVar17->sizes)._width;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar20;
  uVar7 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar4,0);
  uVar13 = uVar10 % uVar7;
  if (uVar10 == 0) {
    uVar10 = 0;
    uVar20 = 0;
  }
  else {
    sVar2 = pbVar17->counter_width;
    wVar3 = (pbVar17->sizes)._field_mask;
    uVar18 = wVar3 << ((ulong)(byte)((char)uVar20 - 1) & 0x3f);
    uVar14 = uVar10;
    uVar12 = 0;
    uVar20 = uVar10;
    do {
      uVar19 = uVar7;
      if (uVar14 < uVar7) {
        uVar19 = uVar13;
      }
      uVar1 = uVar19 + uVar12;
      lVar11 = uVar10 * this->_index;
      lVar16 = uVar12 + lVar11;
      uVar12 = lVar11 + uVar1;
      uVar10 = (pbVar17->sizes)._width;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar10;
      uVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar5,0) + lVar16;
      if (uVar8 < uVar12) {
        uVar12 = uVar8;
      }
      wVar9 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&(pbVar17->sizes)._bits,lVar16 * uVar10,uVar12 * uVar10);
      lVar16 = uVar19 * sVar2;
      bVar15 = 0x40 - (-(char)lVar16 & 0x3fU);
      sVar6 = (bVar15 < 0x41) * ('@' - bVar15);
      lVar11 = POPCOUNT(((wVar9 | uVar18) - wVar3 * index << sVar6) >> sVar6 & uVar18);
      if (lVar16 == 0) {
        lVar11 = 0;
      }
      uVar20 = uVar20 - lVar11;
      uVar14 = uVar14 - uVar19;
      pbVar17 = this->_vector;
      uVar10 = pbVar17->degree;
      uVar12 = uVar1;
    } while (uVar1 < uVar10);
  }
  if (uVar20 != 0) {
    lVar11 = uVar10 * this->_index;
    sVar2 = (pbVar17->sizes)._width;
    wVar9 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar17->sizes)._bits,(lVar11 + -1 + uVar20) * sVar2,
                       (lVar11 + uVar20) * sVar2);
    index = index - wVar9;
  }
  pVar21.second = index;
  pVar21.first = uVar20;
  return pVar21;
}

Assistant:

std::pair<size_t, size_t>
            find_insert_point(size_t index) const
            {
                assert(is_node());
                
                using word_type = typename packed_data::word_type;
                
                size_t len = degree();
                const word_type field_mask   = _vector.sizes.field_mask();
                const word_type flag_mask    = _vector.sizes.flag_mask();
                const size_t width           = _vector.counter_width;
                const size_t fields_per_word = _vector.sizes.elements_per_word();
                const size_t rem             = len % fields_per_word;
                
                ensure_bitsize(index, width - 1);
                
                size_t child = len;
                for(size_t step, p = 0; p < degree(); len -= step, p += step)
                {
                    step = len < fields_per_word ? rem : fields_per_word;
                    
                    word_type word = word_type(sizes(p, p + step)) |
                                     flag_mask;
                    
                    child -= popcount(lowbits(flag_mask &
                                              (word - index * field_mask),
                                              step * width));
                }
                
                assert(len == 0);
                
                size_t new_index = index;
                if(child > 0)
                    new_index -= sizes(child - 1);
                
                return { child, new_index };
            }